

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void dr_prediction_z1_4xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined4 uVar1;
  undefined6 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined6 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  uint in_R8D;
  int in_R9D;
  short sVar9;
  ushort uVar10;
  short sVar14;
  short sVar15;
  ulong uVar11;
  short sVar16;
  short sVar17;
  ushort uVar18;
  short sVar20;
  short sVar21;
  ulong uVar19;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  short sVar22;
  int i;
  int base_max_diff;
  int base;
  __m128i a1_above;
  __m128i a0_above;
  __m128i shift;
  __m128i res1;
  __m128i res;
  __m128i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m128i c3f;
  __m128i diff;
  __m128i a16;
  __m128i a32;
  __m128i a1;
  __m128i a0;
  int max_base_x;
  int frac_bits;
  int local_5fc;
  undefined8 local_5f8 [36];
  int local_4d4;
  int local_4d0;
  int local_4cc;
  undefined8 local_4c8;
  ulong uStack_4c0;
  undefined1 local_4b8 [16];
  ushort local_4a8;
  ushort uStack_4a6;
  ushort uStack_4a4;
  ushort uStack_4a2;
  ushort uStack_4a0;
  ushort uStack_49e;
  ushort uStack_49c;
  ushort uStack_49a;
  ushort local_498;
  ushort uStack_496;
  ushort uStack_494;
  ushort uStack_492;
  ushort uStack_490;
  ushort uStack_48e;
  ushort uStack_48c;
  ushort uStack_48a;
  char local_488;
  char cStack_487;
  char cStack_486;
  byte bStack_485;
  char cStack_484;
  byte bStack_483;
  char cStack_482;
  byte bStack_481;
  char cStack_480;
  char cStack_47f;
  char cStack_47e;
  byte bStack_47d;
  char cStack_47c;
  byte bStack_47b;
  char cStack_47a;
  byte bStack_479;
  short local_478;
  short sStack_476;
  short sStack_474;
  short sStack_472;
  short sStack_470;
  short sStack_46e;
  short sStack_46c;
  short sStack_46a;
  int local_460;
  int local_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  int local_3e0;
  int local_3dc;
  byte local_3d4;
  undefined8 *local_3c8;
  undefined4 local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined2 local_392;
  undefined2 local_390;
  undefined2 local_38e;
  undefined2 local_38c;
  undefined1 local_389;
  undefined8 *local_388;
  undefined1 (*local_380) [16];
  uint8_t local_378 [8];
  uint8_t auStack_370 [8];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined4 local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined4 local_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined4 local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined4 local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined2 local_76;
  int i_1;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  ulong local_68;
  ulong uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_10 [3];
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  undefined1 local_8 [3];
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  
  local_3bc = 4;
  local_3c8 = local_5f8;
  local_3dc = 6 - in_R8D;
  local_3d4 = (byte)in_R8D;
  local_3e0 = in_EDI + 3 << (local_3d4 & 0x1f);
  local_38c = 0x10;
  local_8a = 0x10;
  local_8c = 0x10;
  local_8e = 0x10;
  local_90 = 0x10;
  local_92 = 0x10;
  local_94 = 0x10;
  local_96 = 0x10;
  local_98 = 0x10;
  local_a8 = 0x10001000100010;
  uStack_a0 = 0x10001000100010;
  local_428 = 0x10001000100010;
  uStack_420 = 0x10001000100010;
  local_389 = *(undefined1 *)(in_RCX + local_3e0);
  local_1 = local_389;
  local_2 = local_389;
  local_3 = local_389;
  local_4 = local_389;
  local_5 = local_389;
  local_8 = (undefined1  [3])CONCAT21(CONCAT11(local_389,local_389),local_389);
  local_9 = local_389;
  local_a = local_389;
  local_b = local_389;
  local_c = local_389;
  local_d = local_389;
  local_10 = (undefined1  [3])CONCAT21(CONCAT11(local_389,local_389),local_389);
  local_28 = CONCAT17(local_389,
                      CONCAT16(local_389,
                               CONCAT15(local_389,CONCAT14(local_389,CONCAT13(local_389,local_10))))
                     );
  uStack_20 = CONCAT17(local_389,
                       CONCAT16(local_389,
                                CONCAT15(local_389,CONCAT14(local_389,CONCAT13(local_389,local_8))))
                      );
  local_458 = local_28;
  uStack_450 = uStack_20;
  local_38e = 0x3f;
  local_6a = 0x3f;
  local_6c = 0x3f;
  local_6e = 0x3f;
  local_70 = 0x3f;
  i_1._2_2_ = 0x3f;
  i_1._0_2_ = 0x3f;
  local_76 = 0x3f;
  local_78 = 0x3f;
  local_88 = 0x3f003f003f003f;
  uStack_80 = 0x3f003f003f003f;
  local_448 = 0x3f003f003f003f;
  uStack_440 = 0x3f003f003f003f;
  local_460 = 0;
  local_45c = in_R9D;
  while( true ) {
    if (in_EDI <= local_460) goto LAB_005376e6;
    local_4cc = local_45c >> ((byte)(6 - in_R8D) & 0x1f);
    local_4d0 = local_3e0 - local_4cc >> (local_3d4 & 0x1f);
    if (local_4d0 < 1) break;
    if (4 < local_4d0) {
      local_4d0 = 4;
    }
    local_380 = (undefined1 (*) [16])(in_RCX + local_4cc);
    local_4b8 = *local_380;
    local_388 = (undefined8 *)(in_RCX + local_4cc + 1);
    local_4c8 = *local_388;
    uStack_4c0 = *(ulong *)(in_RCX + local_4cc + 9);
    if (in_R8D == 0) {
      local_390 = (undefined2)local_45c;
      local_4a = (undefined2)local_45c;
      local_4c = (undefined2)local_45c;
      local_4e = (undefined2)local_45c;
      local_50 = (undefined2)local_45c;
      local_52 = (undefined2)local_45c;
      local_54 = (undefined2)local_45c;
      local_56 = (undefined2)local_45c;
      local_58 = (undefined2)local_45c;
      local_68 = CONCAT26((undefined2)local_45c,
                          CONCAT24((undefined2)local_45c,
                                   CONCAT22((undefined2)local_45c,(undefined2)local_45c)));
      uStack_60 = CONCAT26((undefined2)local_45c,
                           CONCAT24((undefined2)local_45c,
                                    CONCAT22((undefined2)local_45c,(undefined2)local_45c)));
      local_2a8 = local_68;
      uStack_2a0 = uStack_60;
      local_2b8 = 0x3f003f003f003f;
      uStack_2b0 = 0x3f003f003f003f;
      local_68 = local_68 & 0x3f003f003f003f;
      uStack_60 = uStack_60 & 0x3f003f003f003f;
      local_2e8 = local_68;
      uStack_2e0 = uStack_60;
      local_2ec = 1;
      local_2e8._0_2_ = (ushort)local_68;
      local_2e8._2_2_ = (ushort)(local_68 >> 0x10);
      local_2e8._4_2_ = (ushort)(local_68 >> 0x20);
      uStack_2e0._0_2_ = (ushort)uStack_60;
      uStack_2e0._2_2_ = (ushort)(uStack_60 >> 0x10);
      uStack_2e0._4_2_ = (ushort)(uStack_60 >> 0x20);
      local_4a8 = (ushort)local_2e8 >> 1;
      uStack_4a6 = local_2e8._2_2_ >> 1;
      uStack_4a4 = local_2e8._4_2_ >> 1;
      uStack_4a2 = (ushort)(local_68 >> 0x31);
      uStack_4a0 = (ushort)uStack_2e0 >> 1;
      uStack_49e = uStack_2e0._2_2_ >> 1;
      uStack_49c = uStack_2e0._4_2_ >> 1;
      uStack_49a = (ushort)(uStack_60 >> 0x31);
    }
    else {
      local_368 = *(undefined8 *)*local_380;
      uStack_360 = *(undefined8 *)(*local_380 + 8);
      local_378[0] = EvenOddMaskx[0][0];
      local_378[1] = EvenOddMaskx[0][1];
      local_378[2] = EvenOddMaskx[0][2];
      local_378[3] = EvenOddMaskx[0][3];
      local_378[4] = EvenOddMaskx[0][4];
      local_378[5] = EvenOddMaskx[0][5];
      local_378[6] = EvenOddMaskx[0][6];
      local_378[7] = EvenOddMaskx[0][7];
      auStack_370[0] = EvenOddMaskx[0][8];
      auStack_370[1] = EvenOddMaskx[0][9];
      auStack_370[2] = EvenOddMaskx[0][10];
      auStack_370[3] = EvenOddMaskx[0][0xb];
      auStack_370[4] = EvenOddMaskx[0][0xc];
      auStack_370[5] = EvenOddMaskx[0][0xd];
      auStack_370[6] = EvenOddMaskx[0][0xe];
      auStack_370[7] = EvenOddMaskx[0][0xf];
      auVar12[8] = EvenOddMaskx[0][8];
      auVar12[9] = EvenOddMaskx[0][9];
      auVar12[10] = EvenOddMaskx[0][10];
      auVar12[0xb] = EvenOddMaskx[0][0xb];
      auVar12[0xc] = EvenOddMaskx[0][0xc];
      auVar12[0xd] = EvenOddMaskx[0][0xd];
      auVar12[0xe] = EvenOddMaskx[0][0xe];
      auVar12[0xf] = EvenOddMaskx[0][0xf];
      auVar12[0] = EvenOddMaskx[0][0];
      auVar12[1] = EvenOddMaskx[0][1];
      auVar12[2] = EvenOddMaskx[0][2];
      auVar12[3] = EvenOddMaskx[0][3];
      auVar12[4] = EvenOddMaskx[0][4];
      auVar12[5] = EvenOddMaskx[0][5];
      auVar12[6] = EvenOddMaskx[0][6];
      auVar12[7] = EvenOddMaskx[0][7];
      local_4b8 = pshufb(*local_380,auVar12);
      auVar12 = local_4b8;
      local_4c8 = local_4b8._8_8_;
      uStack_4c0 = 0;
      local_392 = (undefined2)local_45c;
      local_2a = (undefined2)local_45c;
      local_2c = (undefined2)local_45c;
      local_2e = (undefined2)local_45c;
      local_30 = (undefined2)local_45c;
      local_32 = (undefined2)local_45c;
      local_34 = (undefined2)local_45c;
      local_36 = (undefined2)local_45c;
      local_38 = (undefined2)local_45c;
      local_48 = CONCAT26((undefined2)local_45c,
                          CONCAT24((undefined2)local_45c,
                                   CONCAT22((undefined2)local_45c,(undefined2)local_45c)));
      uStack_40 = CONCAT26((undefined2)local_45c,
                           CONCAT24((undefined2)local_45c,
                                    CONCAT22((undefined2)local_45c,(undefined2)local_45c)));
      local_288 = local_48;
      uStack_280 = uStack_40;
      auVar13._8_8_ = uStack_40;
      auVar13._0_8_ = local_48;
      local_2c8 = psllw(auVar13,ZEXT416(in_R8D));
      local_2d8 = 0x3f003f003f003f;
      uStack_2d0 = 0x3f003f003f003f;
      uVar11 = local_2c8._0_8_ & 0x3f003f003f003f;
      uVar19 = local_2c8._8_8_ & 0x3f003f003f003f;
      local_348 = uVar11;
      uStack_340 = uVar19;
      local_34c = 1;
      local_348._0_2_ = (ushort)uVar11;
      local_348._2_2_ = (ushort)(uVar11 >> 0x10);
      local_348._4_2_ = (ushort)(uVar11 >> 0x20);
      uStack_340._0_2_ = (ushort)uVar19;
      uStack_340._2_2_ = (ushort)(uVar19 >> 0x10);
      uStack_340._4_2_ = (ushort)(uVar19 >> 0x20);
      local_4a8 = (ushort)local_348 >> 1;
      uStack_4a6 = local_348._2_2_ >> 1;
      uStack_4a4 = local_348._4_2_ >> 1;
      uStack_4a2 = (ushort)(uVar11 >> 0x31);
      uStack_4a0 = (ushort)uStack_340 >> 1;
      uStack_49e = uStack_340._2_2_ >> 1;
      uStack_49c = uStack_340._4_2_ >> 1;
      uStack_49a = (ushort)(uVar19 >> 0x31);
      local_4b8 = auVar12;
    }
    local_208 = local_4b8;
    local_208._0_8_ = local_4b8._0_8_;
    auVar12 = pmovzxbw(local_4b8,local_208._0_8_);
    local_218._8_8_ = uStack_4c0;
    local_218._0_8_ = local_4c8;
    auVar13 = pmovzxbw(local_218,local_4c8);
    local_408._0_8_ = auVar13._0_8_;
    local_408._8_8_ = auVar13._8_8_;
    local_3f8._0_8_ = auVar12._0_8_;
    local_3f8._8_8_ = auVar12._8_8_;
    local_1c8 = local_408._0_8_;
    uStack_1c0 = local_408._8_8_;
    local_1d8 = local_3f8._0_8_;
    uStack_1d0 = local_3f8._8_8_;
    local_1c8._0_2_ = auVar13._0_2_;
    local_1c8._2_2_ = auVar13._2_2_;
    local_1c8._4_2_ = auVar13._4_2_;
    local_1c8._6_2_ = auVar13._6_2_;
    uStack_1c0._0_2_ = auVar13._8_2_;
    uStack_1c0._2_2_ = auVar13._10_2_;
    uStack_1c0._4_2_ = auVar13._12_2_;
    uStack_1c0._6_2_ = auVar13._14_2_;
    local_1d8._0_2_ = auVar12._0_2_;
    local_1d8._2_2_ = auVar12._2_2_;
    local_1d8._4_2_ = auVar12._4_2_;
    local_1d8._6_2_ = auVar12._6_2_;
    uStack_1d0._0_2_ = auVar12._8_2_;
    uStack_1d0._2_2_ = auVar12._10_2_;
    uStack_1d0._4_2_ = auVar12._12_2_;
    uStack_1d0._6_2_ = auVar12._14_2_;
    local_248 = local_3f8._0_8_;
    uStack_240 = local_3f8._8_8_;
    local_24c = 5;
    auVar12 = psllw(auVar12,ZEXT416(5));
    local_418 = auVar12._0_8_;
    uStack_410 = auVar12._8_8_;
    local_148 = local_418;
    uStack_140 = uStack_410;
    local_158 = 0x10001000100010;
    uStack_150 = 0x10001000100010;
    local_148._0_2_ = auVar12._0_2_;
    local_148._2_2_ = auVar12._2_2_;
    local_148._4_2_ = auVar12._4_2_;
    local_148._6_2_ = auVar12._6_2_;
    uStack_140._0_2_ = auVar12._8_2_;
    uStack_140._2_2_ = auVar12._10_2_;
    uStack_140._4_2_ = auVar12._12_2_;
    uStack_140._6_2_ = auVar12._14_2_;
    local_418._0_4_ = CONCAT22(local_148._2_2_ + 0x10,(short)local_148 + 0x10);
    local_418._0_6_ = CONCAT24(local_148._4_2_ + 0x10,(undefined4)local_418);
    local_418 = CONCAT26(local_148._6_2_ + 0x10,(undefined6)local_418);
    uStack_410._0_2_ = (short)uStack_140 + 0x10;
    uStack_410._2_2_ = uStack_140._2_2_ + 0x10;
    uStack_410._4_2_ = uStack_140._4_2_ + 0x10;
    uStack_410._6_2_ = uStack_140._6_2_ + 0x10;
    local_108 = CONCAT26(local_1c8._6_2_ - local_1d8._6_2_,
                         CONCAT24(local_1c8._4_2_ - local_1d8._4_2_,
                                  CONCAT22(local_1c8._2_2_ - local_1d8._2_2_,
                                           (short)local_1c8 - (short)local_1d8)));
    uStack_100 = CONCAT26(uStack_1c0._6_2_ - uStack_1d0._6_2_,
                          CONCAT24(uStack_1c0._4_2_ - uStack_1d0._4_2_,
                                   CONCAT22(uStack_1c0._2_2_ - uStack_1d0._2_2_,
                                            (short)uStack_1c0 - (short)uStack_1d0)));
    local_118 = CONCAT26(uStack_4a2,CONCAT24(uStack_4a4,CONCAT22(uStack_4a6,local_4a8)));
    uStack_110 = CONCAT26(uStack_49a,CONCAT24(uStack_49c,CONCAT22(uStack_49e,uStack_4a0)));
    sVar9 = ((short)local_1c8 - (short)local_1d8) * local_4a8;
    sVar14 = (local_1c8._2_2_ - local_1d8._2_2_) * uStack_4a6;
    sVar15 = (local_1c8._4_2_ - local_1d8._4_2_) * uStack_4a4;
    sVar16 = (local_1c8._6_2_ - local_1d8._6_2_) * uStack_4a2;
    sVar17 = ((short)uStack_1c0 - (short)uStack_1d0) * uStack_4a0;
    sVar20 = (uStack_1c0._2_2_ - uStack_1d0._2_2_) * uStack_49e;
    sVar21 = (uStack_1c0._4_2_ - uStack_1d0._4_2_) * uStack_49c;
    sVar22 = (uStack_1c0._6_2_ - uStack_1d0._6_2_) * uStack_49a;
    local_168 = local_418;
    uStack_160 = uStack_410;
    local_178 = CONCAT26(sVar16,CONCAT24(sVar15,CONCAT22(sVar14,sVar9)));
    uStack_170 = CONCAT26(sVar22,CONCAT24(sVar21,CONCAT22(sVar20,sVar17)));
    uVar10 = (short)local_148 + 0x10 + sVar9;
    sVar14 = local_148._2_2_ + 0x10 + sVar14;
    sVar15 = local_148._4_2_ + 0x10 + sVar15;
    sVar16 = local_148._6_2_ + 0x10 + sVar16;
    uVar18 = (short)uStack_140 + 0x10 + sVar17;
    sVar20 = uStack_140._2_2_ + 0x10 + sVar20;
    sVar21 = uStack_140._4_2_ + 0x10 + sVar21;
    sVar22 = uStack_140._6_2_ + 0x10 + sVar22;
    cStack_486 = (char)sVar14;
    bStack_485 = (byte)((ushort)sVar14 >> 8);
    cStack_484 = (char)sVar15;
    bStack_483 = (byte)((ushort)sVar15 >> 8);
    cStack_482 = (char)sVar16;
    bStack_481 = (byte)((ushort)sVar16 >> 8);
    cStack_47e = (char)sVar20;
    bStack_47d = (byte)((ushort)sVar20 >> 8);
    cStack_47c = (char)sVar21;
    bStack_47b = (byte)((ushort)sVar21 >> 8);
    cStack_47a = (char)sVar22;
    bStack_479 = (byte)((ushort)sVar22 >> 8);
    uVar1 = CONCAT13(bStack_485,CONCAT12(cStack_486,uVar10));
    uVar2 = CONCAT15(bStack_483,CONCAT14(cStack_484,uVar1));
    local_308 = CONCAT17(bStack_481,CONCAT16(cStack_482,uVar2));
    uVar4 = CONCAT13(bStack_47d,CONCAT12(cStack_47e,uVar18));
    uVar5 = CONCAT15(bStack_47b,CONCAT14(cStack_47c,uVar4));
    uStack_300 = CONCAT17(bStack_479,CONCAT16(cStack_47a,uVar5));
    local_30c = 5;
    uVar10 = uVar10 >> 5;
    uVar18 = uVar18 >> 5;
    cStack_486 = (char)(ushort)((uint)uVar1 >> 0x15);
    bStack_485 = bStack_485 >> 5;
    cStack_484 = (char)(ushort)((uint6)uVar2 >> 0x25);
    bStack_483 = bStack_483 >> 5;
    cStack_482 = (char)(ushort)((ulong)local_308 >> 0x35);
    bStack_481 = bStack_481 >> 5;
    cStack_47e = (char)(ushort)((uint)uVar4 >> 0x15);
    bStack_47d = bStack_47d >> 5;
    cStack_47c = (char)(ushort)((uint6)uVar5 >> 0x25);
    bStack_47b = bStack_47b >> 5;
    cStack_47a = (char)(ushort)((ulong)uStack_300 >> 0x35);
    bStack_479 = bStack_479 >> 5;
    local_228 = local_4b8 >> 0x40;
    local_228._0_8_ = local_4b8._8_8_;
    local_3f8 = pmovzxbw(local_4b8 >> 0x40,local_228._0_8_);
    local_238._8_8_ = 0;
    local_238._0_8_ = uStack_4c0;
    local_408 = pmovzxbw(local_238,uStack_4c0);
    local_1e8 = local_408._0_8_;
    uStack_1e0 = local_408._8_8_;
    local_1f8 = local_3f8._0_8_;
    uStack_1f0 = local_3f8._8_8_;
    local_1e8._0_2_ = local_408._0_2_;
    local_1e8._2_2_ = local_408._2_2_;
    local_1e8._4_2_ = local_408._4_2_;
    local_1e8._6_2_ = local_408._6_2_;
    uStack_1e0._0_2_ = local_408._8_2_;
    uStack_1e0._2_2_ = local_408._10_2_;
    uStack_1e0._4_2_ = local_408._12_2_;
    uStack_1e0._6_2_ = local_408._14_2_;
    local_1f8._0_2_ = local_3f8._0_2_;
    local_1f8._2_2_ = local_3f8._2_2_;
    local_1f8._4_2_ = local_3f8._4_2_;
    local_1f8._6_2_ = local_3f8._6_2_;
    uStack_1f0._0_2_ = local_3f8._8_2_;
    uStack_1f0._2_2_ = local_3f8._10_2_;
    uStack_1f0._4_2_ = local_3f8._12_2_;
    uStack_1f0._6_2_ = local_3f8._14_2_;
    local_438 = (short)local_1e8 - (short)local_1f8;
    sStack_436 = local_1e8._2_2_ - local_1f8._2_2_;
    sStack_434 = local_1e8._4_2_ - local_1f8._4_2_;
    sStack_432 = local_1e8._6_2_ - local_1f8._6_2_;
    sStack_430 = (short)uStack_1e0 - (short)uStack_1f0;
    sStack_42e = uStack_1e0._2_2_ - uStack_1f0._2_2_;
    sStack_42c = uStack_1e0._4_2_ - uStack_1f0._4_2_;
    sStack_42a = uStack_1e0._6_2_ - uStack_1f0._6_2_;
    local_268 = local_3f8._0_8_;
    uStack_260 = local_3f8._8_8_;
    local_26c = 5;
    auVar12 = psllw(local_3f8,ZEXT416(5));
    local_418 = auVar12._0_8_;
    uStack_410 = auVar12._8_8_;
    local_188 = local_418;
    uStack_180 = uStack_410;
    local_198 = 0x10001000100010;
    uStack_190 = 0x10001000100010;
    local_188._0_2_ = auVar12._0_2_;
    local_188._2_2_ = auVar12._2_2_;
    local_188._4_2_ = auVar12._4_2_;
    local_188._6_2_ = auVar12._6_2_;
    uStack_180._0_2_ = auVar12._8_2_;
    uStack_180._2_2_ = auVar12._10_2_;
    uStack_180._4_2_ = auVar12._12_2_;
    uStack_180._6_2_ = auVar12._14_2_;
    local_418._0_4_ = CONCAT22(local_188._2_2_ + 0x10,(short)local_188 + 0x10);
    local_418._0_6_ = CONCAT24(local_188._4_2_ + 0x10,(undefined4)local_418);
    local_418 = CONCAT26(local_188._6_2_ + 0x10,(undefined6)local_418);
    uStack_410._0_2_ = (short)uStack_180 + 0x10;
    uStack_410._2_2_ = uStack_180._2_2_ + 0x10;
    uStack_410._4_2_ = uStack_180._4_2_ + 0x10;
    uStack_410._6_2_ = uStack_180._6_2_ + 0x10;
    local_128 = CONCAT26(sStack_432,CONCAT24(sStack_434,CONCAT22(sStack_436,local_438)));
    uStack_120 = CONCAT26(sStack_42a,CONCAT24(sStack_42c,CONCAT22(sStack_42e,sStack_430)));
    local_138 = CONCAT26(uStack_4a2,CONCAT24(uStack_4a4,CONCAT22(uStack_4a6,local_4a8)));
    uStack_130 = CONCAT26(uStack_49a,CONCAT24(uStack_49c,CONCAT22(uStack_49e,uStack_4a0)));
    local_478 = local_438 * local_4a8;
    sStack_476 = sStack_436 * uStack_4a6;
    sStack_474 = sStack_434 * uStack_4a4;
    sStack_472 = sStack_432 * uStack_4a2;
    sStack_470 = sStack_430 * uStack_4a0;
    sStack_46e = sStack_42e * uStack_49e;
    sStack_46c = sStack_42c * uStack_49c;
    sStack_46a = sStack_42a * uStack_49a;
    local_1a8 = local_418;
    uStack_1a0 = uStack_410;
    local_1b8 = CONCAT26(sStack_472,CONCAT24(sStack_474,CONCAT22(sStack_476,local_478)));
    uStack_1b0 = CONCAT26(sStack_46a,CONCAT24(sStack_46c,CONCAT22(sStack_46e,sStack_470)));
    local_498 = (short)local_188 + 0x10 + local_478;
    uStack_496 = local_188._2_2_ + 0x10 + sStack_476;
    uStack_494 = local_188._4_2_ + 0x10 + sStack_474;
    uStack_492 = local_188._6_2_ + 0x10 + sStack_472;
    uStack_490 = (short)uStack_180 + 0x10 + sStack_470;
    uStack_48e = uStack_180._2_2_ + 0x10 + sStack_46e;
    uStack_48c = uStack_180._4_2_ + 0x10 + sStack_46c;
    uStack_48a = uStack_180._6_2_ + 0x10 + sStack_46a;
    local_328 = CONCAT26(uStack_492,CONCAT24(uStack_494,CONCAT22(uStack_496,local_498)));
    uStack_320 = CONCAT26(uStack_48a,CONCAT24(uStack_48c,CONCAT22(uStack_48e,uStack_490)));
    local_32c = 5;
    local_498 = local_498 >> 5;
    uStack_496 = uStack_496 >> 5;
    uStack_494 = uStack_494 >> 5;
    uStack_492 = uStack_492 >> 5;
    uStack_490 = uStack_490 >> 5;
    uStack_48e = uStack_48e >> 5;
    uStack_48c = uStack_48c >> 5;
    uStack_48a = uStack_48a >> 5;
    uVar1 = CONCAT13(bStack_485,CONCAT12(cStack_486,uVar10));
    uVar2 = CONCAT15(bStack_483,CONCAT14(cStack_484,uVar1));
    uVar3 = CONCAT17(bStack_481,CONCAT16(cStack_482,uVar2));
    uVar4 = CONCAT13(bStack_47d,CONCAT12(cStack_47e,uVar18));
    uVar5 = CONCAT15(bStack_47b,CONCAT14(cStack_47c,uVar4));
    uVar6 = CONCAT17(bStack_479,CONCAT16(cStack_47a,uVar5));
    local_e8 = uVar3;
    uStack_e0 = uVar6;
    local_f8 = CONCAT26(uStack_492,CONCAT24(uStack_494,CONCAT22(uStack_496,local_498)));
    uStack_f0 = CONCAT26(uStack_48a,CONCAT24(uStack_48c,CONCAT22(uStack_48e,uStack_490)));
    local_e8._2_2_ = (ushort)((uint)uVar1 >> 0x10);
    local_e8._4_2_ = (ushort)((uint6)uVar2 >> 0x20);
    local_e8._6_2_ = (ushort)((ulong)uVar3 >> 0x30);
    uStack_e0._2_2_ = (ushort)((uint)uVar4 >> 0x10);
    uStack_e0._4_2_ = (ushort)((uint6)uVar5 >> 0x20);
    uStack_e0._6_2_ = (ushort)((ulong)uVar6 >> 0x30);
    local_488 = (uVar10 != 0) * (uVar10 < 0x100) * (char)uVar10 - (0xff < uVar10);
    cStack_487 = (local_e8._2_2_ != 0) * (local_e8._2_2_ < 0x100) * cStack_486 -
                 (0xff < local_e8._2_2_);
    cStack_486 = (local_e8._4_2_ != 0) * (local_e8._4_2_ < 0x100) * cStack_484 -
                 (0xff < local_e8._4_2_);
    bStack_485 = (local_e8._6_2_ != 0) * (local_e8._6_2_ < 0x100) * cStack_482 -
                 (0xff < local_e8._6_2_);
    cStack_484 = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
    bStack_483 = (uStack_e0._2_2_ != 0) * (uStack_e0._2_2_ < 0x100) * cStack_47e -
                 (0xff < uStack_e0._2_2_);
    cStack_482 = (uStack_e0._4_2_ != 0) * (uStack_e0._4_2_ < 0x100) * cStack_47c -
                 (0xff < uStack_e0._4_2_);
    bStack_481 = (uStack_e0._6_2_ != 0) * (uStack_e0._6_2_ < 0x100) * cStack_47a -
                 (0xff < uStack_e0._6_2_);
    cStack_480 = (local_498 != 0) * (local_498 < 0x100) * (char)local_498 - (0xff < local_498);
    cStack_47f = (uStack_496 != 0) * (uStack_496 < 0x100) * (char)uStack_496 - (0xff < uStack_496);
    cStack_47e = (uStack_494 != 0) * (uStack_494 < 0x100) * (char)uStack_494 - (0xff < uStack_494);
    bStack_47d = (uStack_492 != 0) * (uStack_492 < 0x100) * (char)uStack_492 - (0xff < uStack_492);
    cStack_47c = (uStack_490 != 0) * (uStack_490 < 0x100) * (char)uStack_490 - (0xff < uStack_490);
    bStack_47b = (uStack_48e != 0) * (uStack_48e < 0x100) * (char)uStack_48e - (0xff < uStack_48e);
    cStack_47a = (uStack_48c != 0) * (uStack_48c < 0x100) * (char)uStack_48c - (0xff < uStack_48c);
    bStack_479 = (uStack_48a != 0) * (uStack_48a < 0x100) * (char)uStack_48a - (0xff < uStack_48a);
    local_c8 = CONCAT17(bStack_481,
                        CONCAT16(cStack_482,
                                 CONCAT15(bStack_483,
                                          CONCAT14(cStack_484,
                                                   CONCAT13(bStack_485,
                                                            CONCAT12(cStack_486,
                                                                     CONCAT11(cStack_487,local_488))
                                                           )))));
    uStack_c0 = CONCAT17(bStack_479,
                         CONCAT16(cStack_47a,
                                  CONCAT15(bStack_47b,
                                           CONCAT14(cStack_47c,
                                                    CONCAT13(bStack_47d,
                                                             CONCAT12(cStack_47e,
                                                                      CONCAT11(cStack_47f,cStack_480
                                                                              )))))));
    local_b8 = local_28;
    uStack_b0 = uStack_20;
    local_d8 = *(undefined8 *)Mask[0][local_4d0];
    uStack_d0 = *(undefined8 *)(Mask[0][local_4d0] + 8);
    auVar8._8_8_ = uStack_20;
    auVar8._0_8_ = local_28;
    auVar7._8_8_ = uStack_c0;
    auVar7._0_8_ = local_c8;
    auVar12 = pblendvb(auVar8,auVar7,(undefined1  [16])Mask[0][local_4d0]);
    *(undefined1 (*) [16])(local_5f8 + (long)local_460 * 2) = auVar12;
    local_45c = in_R9D + local_45c;
    local_460 = local_460 + 1;
  }
  for (local_4d4 = local_460; local_4d4 < in_EDI; local_4d4 = local_4d4 + 1) {
    local_5f8[(long)local_4d4 * 2] = local_28;
    local_5f8[(long)local_4d4 * 2 + 1] = uStack_20;
  }
LAB_005376e6:
  for (local_5fc = 0; local_5fc < in_EDI; local_5fc = local_5fc + 1) {
    local_3a8 = local_5f8[(long)local_5fc * 2];
    uStack_3a0 = local_5f8[(long)local_5fc * 2 + 1];
    local_3b8 = local_3a8;
    uStack_3b0 = local_5f8[(long)local_5fc * 2 + 1];
    local_3b8._0_4_ = (undefined4)local_3a8;
    *(undefined4 *)(in_RSI + in_RDX * local_5fc) = (undefined4)local_3b8;
  }
  return;
}

Assistant:

static void dr_prediction_z1_4xN_sse4_1(int N, uint8_t *dst, ptrdiff_t stride,
                                        const uint8_t *above,
                                        int upsample_above, int dx) {
  __m128i dstvec[16];

  dr_prediction_z1_HxW_internal_sse4_1(4, N, dstvec, above, upsample_above, dx);
  for (int i = 0; i < N; i++) {
    *(int *)(dst + stride * i) = _mm_cvtsi128_si32(dstvec[i]);
  }
}